

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O3

size_t __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::trimLeft
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,StringRef *charSet)

{
  BufHdr *pBVar1;
  size_t sVar2;
  
  sVar2 = StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::findNotOneOf
                    (&this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>,charSet,0);
  if (sVar2 == 0xffffffffffffffff) {
    pBVar1 = (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_hdr;
    if (pBVar1 != (BufHdr *)0x0) {
      if ((pBVar1->super_RefCount).m_refCount == 1) {
        (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p = (C *)(pBVar1 + 1)
        ;
        *(undefined1 *)&pBVar1[1].super_RefCount._vptr_RefCount = 0;
        (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length = 0;
      }
      else {
        StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release
                  (&this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
      }
    }
    sVar2 = 0;
  }
  else {
    (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p =
         (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p + sVar2;
    sVar2 = (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length - sVar2;
    (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length = sVar2;
  }
  return sVar2;
}

Assistant:

size_t
	trimLeft(const StringRef& charSet) {
		size_t i = this->findNotOneOf(charSet);
		if (i == -1) {
			clear();
			return 0;
		}

		this->m_p += i;
		this->m_length -= i;
		return this->m_length;
	}